

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exereader.cpp
# Opt level: O1

resource loader::anon_unknown_0::pe_reader::find_resource
                   (istream *is,uint32_t name,uint32_t type,uint32_t language)

{
  uint uVar1;
  ushort uVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  uint *puVar6;
  resource rVar7;
  uint uVar8;
  ulong uVar9;
  ulong extraout_RDX;
  ulong uVar10;
  size_type __len;
  uint unaff_R12D;
  uint uVar11;
  uint *puVar12;
  value_type *__val;
  uint *puVar13;
  char buffer [2];
  uint local_40;
  uint32_t local_3c;
  uint32_t local_38;
  uint32_t local_34;
  
  uVar9 = (ulong)language;
  local_3c = language;
  local_38 = name;
  local_34 = type;
  std::istream::seekg((long)is,_S_end);
  std::istream::read((char *)is,(long)&local_40);
  uVar1 = local_40;
  uVar2 = (ushort)local_40;
  uVar10 = (ulong)(ushort)local_40;
  std::istream::seekg((long)is,0xc);
  std::istream::read((char *)is,(long)&local_40);
  uVar11 = local_40 & 0xffff;
  std::istream::seekg((long)is,_S_end);
  iVar4 = std::istream::tellg();
  std::istream::read((char *)is,(long)&local_40);
  if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) == 0) {
    std::istream::seekg((long)is,(uint)((ushort)local_40 == 0x20b) * 0x10 + 0x5a);
    std::istream::read((char *)is,(long)&local_40);
    bVar3 = false;
    if ((2 < local_40) &&
       (uVar8 = *(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) & 5,
       uVar9 = (ulong)uVar8, uVar8 == 0)) {
      std::istream::seekg((long)is,0x10);
      std::istream::read((char *)is,(long)&local_40);
      unaff_R12D = local_40;
      std::istream::read((char *)is,(long)&local_40);
      if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) == 0) {
        uVar9 = CONCAT71((int7)(uVar9 >> 8),unaff_R12D != 0);
        bVar3 = local_40 != 0 && unaff_R12D != 0;
      }
      else {
        bVar3 = false;
      }
    }
  }
  else {
    bVar3 = false;
  }
  if (!bVar3) {
    rVar7.offset = 0;
    rVar7.size = 0;
    return rVar7;
  }
  std::istream::seekg(is,iVar4 + uVar11,0);
  if (uVar10 == 0) {
    puVar13 = (uint *)0x0;
    puVar6 = (uint *)0x0;
  }
  else {
    puVar6 = (uint *)operator_new((ulong)((uVar1 & 0xffff) * 4) * 3);
    puVar6[2] = 0;
    puVar6[0] = 0;
    puVar6[1] = 0;
    if (uVar2 != 1) {
      uVar9 = 0xc;
      do {
        *(uint *)((long)puVar6 + uVar9 + 8) = puVar6[2];
        *(undefined8 *)((long)puVar6 + uVar9) = *(undefined8 *)puVar6;
        uVar9 = uVar9 + 0xc;
      } while ((ulong)((uVar1 & 0xffff) * 4) * 3 != uVar9);
    }
    puVar13 = puVar6 + uVar10 * 3;
  }
  if (puVar6 != puVar13) {
    puVar12 = puVar6;
    do {
      std::istream::seekg((long)is,8);
      std::istream::read((char *)is,(long)&local_40);
      *puVar12 = local_40;
      std::istream::read((char *)is,(long)&local_40);
      puVar12[1] = local_40;
      std::istream::seekg((long)is,4);
      std::istream::read((char *)is,(long)&local_40);
      puVar12[2] = local_40;
      std::istream::seekg((long)is,0x10);
      puVar12 = puVar12 + 3;
    } while (puVar12 != puVar13);
  }
  uVar10 = 0;
  puVar12 = puVar6;
  if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) == 0) {
    for (; puVar12 != puVar13; puVar12 = puVar12 + 3) {
      uVar1 = puVar12[1];
      bVar3 = true;
      if ((uVar1 <= unaff_R12D) && (unaff_R12D < uVar1 + *puVar12)) {
        bVar3 = false;
        uVar9 = (ulong)((unaff_R12D - uVar1) + puVar12[2]);
      }
      if (!bVar3) {
        uVar10 = uVar9 & 0xffffffff;
        break;
      }
    }
    iVar4 = (int)uVar10;
    if (iVar4 != 0) {
      std::istream::seekg(is,uVar10,0);
      uVar5 = find_resource_entry(is,local_34);
      if ((int)uVar5 < 0) {
        std::istream::seekg(is,(uVar5 & 0x7fffffff) + iVar4,0);
        uVar5 = find_resource_entry(is,local_38);
        if ((int)uVar5 < 0) {
          std::istream::seekg(is,(uVar5 & 0x7fffffff) + iVar4,0);
          uVar5 = find_resource_entry(is,local_3c);
          if (0 < (int)uVar5) {
            std::istream::seekg(is,uVar5 + iVar4,0);
            std::istream::read((char *)is,(long)&local_40);
            uVar1 = local_40;
            std::istream::read((char *)is,(long)&local_40);
            uVar9 = 0;
            if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) == 0) {
              uVar10 = extraout_RDX;
              for (puVar12 = puVar6; puVar12 != puVar13; puVar12 = puVar12 + 3) {
                uVar11 = puVar12[1];
                bVar3 = true;
                if ((uVar11 <= uVar1) && (uVar1 < uVar11 + *puVar12)) {
                  bVar3 = false;
                  uVar10 = (ulong)((uVar1 - uVar11) + puVar12[2]);
                }
                if (!bVar3) {
                  uVar9 = uVar10 & 0xffffffff;
                  break;
                }
              }
              uVar10 = 0;
              if ((int)uVar9 != 0) {
                uVar10 = (ulong)local_40 << 0x20;
              }
              goto LAB_00133deb;
            }
          }
        }
      }
    }
  }
  uVar9 = 0;
  uVar10 = 0;
LAB_00133deb:
  if (puVar6 != (uint *)0x0) {
    operator_delete(puVar6,(long)puVar13 - (long)puVar6);
  }
  return (resource)(uVar10 | uVar9);
}

Assistant:

pe_reader::resource pe_reader::find_resource(std::istream & is, boost::uint32_t name,
                                             boost::uint32_t type,
                                             boost::uint32_t language) {
	
	resource result;
	result.offset = result.size = 0;
	
	header coff;
	if(!coff.load(is)) {
		return result;
	}
	
	section_table sections;
	if(!sections.load(is, coff)) {
		return result;
	}
	
	boost::uint32_t resource_offset = sections.to_file_offset(coff.resource_table_address);
	if(!resource_offset) {
		return result;
	}
	
	is.seekg(resource_offset);
	boost::uint32_t type_offset = find_resource_entry(is, type);
	if(!get_resource_table(type_offset, resource_offset)) {
		return result;
	}
	
	is.seekg(type_offset);
	boost::uint32_t name_offset = find_resource_entry(is, name);
	if(!get_resource_table(name_offset, resource_offset)) {
		return result;
	}
	
	is.seekg(name_offset);
	boost::uint32_t leaf_offset = find_resource_entry(is, language);
	if(!leaf_offset || get_resource_table(leaf_offset, resource_offset)) {
		return result;
	}
	
	// Virtual memory address and size of the resource data.
	is.seekg(leaf_offset);
	boost::uint32_t data_address = util::load<boost::uint32_t>(is);
	boost::uint32_t data_size = util::load<boost::uint32_t>(is);
	// ignore codepage and reserved word
	if(is.fail()) {
		return result;
	}
	
	boost::uint32_t data_offset = sections.to_file_offset(data_address);
	if(!data_offset) {
		return result;
	}
	
	result.offset = data_offset;
	result.size = data_size;
	
	return result;
}